

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O0

optional<std::pair<unsigned_long,_unsigned_long>_> * __thiscall
google::protobuf::io::Printer::GetSubstitutionRange
          (optional<std::pair<unsigned_long,_unsigned_long>_> *__return_storage_ptr__,Printer *this,
          string_view varname,PrintOptions opts)

{
  PrintOptions opts_00;
  PrintOptions opts_01;
  bool bVar1;
  pointer prVar2;
  anon_class_32_2_eef9dd55 local_f8;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_d8;
  undefined8 local_c1;
  bool local_b9;
  undefined1 local_b8 [8];
  pair<unsigned_long,_unsigned_long> range;
  anon_class_16_1_91798912 local_90;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_80;
  undefined8 local_69;
  bool local_61;
  iterator local_60;
  undefined1 local_50 [8];
  iterator it;
  Printer *this_local;
  PrintOptions opts_local;
  string_view varname_local;
  
  opts_local.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
  _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>._0_1_ =
       opts.use_annotation_frames;
  opts_local._1_8_ = varname._M_len;
  it.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)this;
  _local_50 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
              ::find<std::basic_string_view<char,std::char_traits<char>>>
                        ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
                          *)&this->substitutions_,
                         (key_arg<std::basic_string_view<char>_> *)
                         &opts_local.loc.
                          super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>
                          ._M_engaged);
  local_60 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
             ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                    *)&this->substitutions_);
  bVar1 = absl::lts_20250127::container_internal::operator!=((iterator *)local_50,&local_60);
  local_61 = (bool)opts_local.loc.
                   super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                   _M_payload.
                   super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>._0_1_
  ;
  local_90.varname._M_len._0_1_ =
       opts_local.loc.
       super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>._M_payload.
       super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>._M_engaged;
  local_90.varname._M_len._1_1_ = opts_local.checks_are_debug_only;
  local_90.varname._M_len._2_1_ = opts_local.use_substitution_map;
  local_90.varname._M_len._3_1_ = opts_local.use_curly_brace_substitutions;
  local_90.varname._M_len._4_1_ = opts_local.allow_digit_substitutions;
  local_90.varname._M_len._5_1_ = opts_local.strip_spaces_around_vars;
  local_90.varname._M_len._6_1_ = opts_local.strip_raw_string_indentation;
  local_90.varname._M_len._7_1_ = opts_local.use_annotation_frames;
  local_90.varname._M_str = varname._M_str;
  local_69 = opts._0_8_;
  absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
  FunctionRef<google::protobuf::io::Printer::GetSubstitutionRange(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::io::Printer::PrintOptions)::__0,void>
            ((FunctionRef<std::__cxx11::string()> *)&local_80,&local_90);
  opts_01.use_annotation_frames = local_61;
  opts_01.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
  _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
       (undefined2)local_69;
  opts_01.checks_are_debug_only = (bool)local_69._2_1_;
  opts_01.use_substitution_map = (bool)local_69._3_1_;
  opts_01.use_curly_brace_substitutions = (bool)local_69._4_1_;
  opts_01.allow_digit_substitutions = (bool)local_69._5_1_;
  opts_01.strip_spaces_around_vars = (bool)local_69._6_1_;
  opts_01.strip_raw_string_indentation = (bool)local_69._7_1_;
  bVar1 = Validate(bVar1,opts_01,local_80);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    prVar2 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
             ::iterator::operator->((iterator *)local_50);
    local_f8.range.first = (prVar2->second).first;
    local_f8.range.second = (prVar2->second).second;
    bVar1 = local_f8.range.first <= local_f8.range.second;
    local_b9 = (bool)opts_local.loc.
                     super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>.
                     _0_1_;
    local_f8.varname._M_len._0_1_ =
         opts_local.loc.
         super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>._M_payload.
         super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>._M_engaged;
    local_f8.varname._M_len._1_1_ = opts_local.checks_are_debug_only;
    local_f8.varname._M_len._2_1_ = opts_local.use_substitution_map;
    local_f8.varname._M_len._3_1_ = opts_local.use_curly_brace_substitutions;
    local_f8.varname._M_len._4_1_ = opts_local.allow_digit_substitutions;
    local_f8.varname._M_len._5_1_ = opts_local.strip_spaces_around_vars;
    local_f8.varname._M_len._6_1_ = opts_local.strip_raw_string_indentation;
    local_f8.varname._M_len._7_1_ = opts_local.use_annotation_frames;
    local_f8.varname._M_str = varname._M_str;
    local_c1 = opts._0_8_;
    local_b8 = (undefined1  [8])local_f8.range.first;
    range.first = local_f8.range.second;
    absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
    FunctionRef<google::protobuf::io::Printer::GetSubstitutionRange(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::io::Printer::PrintOptions)::__1,void>
              ((FunctionRef<std::__cxx11::string()> *)&local_d8,&local_f8);
    opts_00.use_annotation_frames = local_b9;
    opts_00.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
    _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
         (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
         (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
         (undefined2)local_c1;
    opts_00.checks_are_debug_only = (bool)local_c1._2_1_;
    opts_00.use_substitution_map = (bool)local_c1._3_1_;
    opts_00.use_curly_brace_substitutions = (bool)local_c1._4_1_;
    opts_00.allow_digit_substitutions = (bool)local_c1._5_1_;
    opts_00.strip_spaces_around_vars = (bool)local_c1._6_1_;
    opts_00.strip_raw_string_indentation = (bool)local_c1._7_1_;
    bVar1 = Validate(bVar1,opts_00,local_d8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::optional<std::pair<unsigned_long,_unsigned_long>_>::
      optional<std::pair<unsigned_long,_unsigned_long>,_true>
                (__return_storage_ptr__,(pair<unsigned_long,_unsigned_long> *)local_b8);
    }
    else {
      std::optional<std::pair<unsigned_long,_unsigned_long>_>::optional(__return_storage_ptr__);
    }
  }
  else {
    std::optional<std::pair<unsigned_long,_unsigned_long>_>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

absl::optional<std::pair<size_t, size_t>> Printer::GetSubstitutionRange(
    absl::string_view varname, PrintOptions opts) {
  auto it = substitutions_.find(varname);
  if (!Validate(it != substitutions_.end(), opts, [varname] {
        return absl::StrCat("undefined variable in annotation: ", varname);
      })) {
    return absl::nullopt;
  }

  std::pair<size_t, size_t> range = it->second;
  if (!Validate(range.first <= range.second, opts, [range, varname] {
        return absl::StrFormat(
            "variable used for annotation used multiple times: %s (%d..%d)",
            varname, range.first, range.second);
      })) {
    return absl::nullopt;
  }

  return range;
}